

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::TypedArrayBase::GetItemSetter
          (TypedArrayBase *this,uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  bool bVar1;
  DescriptorFlags DVar2;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  
  bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
    if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
  }
  if (index < (this->super_ArrayBufferParent).super_ArrayObject.length) {
    DVar2 = DynamicObject::GetItemSetter((DynamicObject *)this,index,setterValue,requestContext);
    return DVar2;
  }
  return None_NoProto;
}

Assistant:

DescriptorFlags TypedArrayBase::GetItemSetter(uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (index >= this->GetLength())
        {
            return None_NoProto;
        }

        return __super::GetItemSetter(index, setterValue, requestContext);
    }